

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00749638 == '\x01') {
    DAT_00749638 = '\0';
    (*(code *)*_Int64Parameter_default_instance_)();
  }
  if (DAT_00749678 == '\x01') {
    DAT_00749678 = '\0';
    (*(code *)*_DoubleParameter_default_instance_)();
  }
  if (DAT_007496a8 == '\x01') {
    DAT_007496a8 = '\0';
    (*(code *)*_StringParameter_default_instance_)();
  }
  if (DAT_007496c8 == '\x01') {
    DAT_007496c8 = 0;
    (*(code *)*_BoolParameter_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64Parameter_default_instance_.Shutdown();
  _DoubleParameter_default_instance_.Shutdown();
  _StringParameter_default_instance_.Shutdown();
  _BoolParameter_default_instance_.Shutdown();
}